

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::~QSystemTrayIconPrivate(QSystemTrayIconPrivate *this)

{
  *(undefined ***)this = &PTR__QSystemTrayIconPrivate_007f0670;
  if (this->qpa_sys != (QPlatformSystemTrayIcon *)0x0) {
    (**(code **)(*(long *)this->qpa_sys + 0x20))();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->toolTip).d);
  QIcon::~QIcon(&this->icon);
  QWeakPointer<QObject>::~QWeakPointer(&(this->menu).wp);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QSystemTrayIconPrivate::~QSystemTrayIconPrivate()
{
    delete qpa_sys;
}